

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCompositeCurve::~IfcCompositeCurve(IfcCompositeCurve *this)

{
  ~IfcCompositeCurve((IfcCompositeCurve *)&this[-1].super_IfcBoundedCurve.field_0x50);
  return;
}

Assistant:

IfcCompositeCurve() : Object("IfcCompositeCurve") {}